

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkBottom(Abc_Ntk_t *pNtk,int Level)

{
  void *pvVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int iVar6;
  long lVar7;
  char Buffer [500];
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x2f7,"Abc_Ntk_t *Abc_NtkBottom(Abc_Ntk_t *, int)");
  }
  if (pNtk->nObjCounts[8] == 0) {
    pNtk_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,pNtk->ntkFunc,1);
    sprintf(Buffer,"%s%s",pNtk->pName,"_bot");
    pcVar3 = Extra_UtilStrsav(Buffer);
    pNtk_00->pName = pcVar3;
    Abc_NtkCleanCopy(pNtk);
    for (iVar6 = 0; iVar6 < pNtk->vPis->nSize; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkPi(pNtk,iVar6);
      Abc_NtkDupObj(pNtk_00,pAVar4,1);
    }
    for (iVar6 = 0; iVar2 = pNtk->vObjs->nSize, iVar6 < iVar2; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar6);
      if (((pAVar4 != (Abc_Obj_t *)0x0) && ((pAVar4->field_6).pTemp == (void *)0x0)) &&
         ((int)(*(uint *)&pAVar4->field_0x14 >> 0xc) <= Level &&
          (*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
        Abc_NtkDupObj(pNtk_00,pAVar4,0);
      }
    }
    for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar6);
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        for (lVar7 = 0; lVar7 < (pAVar4->vFanins).nSize; lVar7 = lVar7 + 1) {
          if (((pAVar4->field_6).pCopy != (Abc_Obj_t *)0x0) &&
             (pAVar5 = *(Abc_Obj_t **)
                        ((long)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar7]] + 0x40),
             pAVar5 != (Abc_Obj_t *)0x0)) {
            Abc_ObjAddFanin((pAVar4->field_6).pCopy,pAVar5);
          }
        }
      }
      iVar2 = pNtk->vObjs->nSize;
    }
    for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar6);
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        for (lVar7 = 0; lVar7 < (pAVar4->vFanins).nSize; lVar7 = lVar7 + 1) {
          if ((((pAVar4->field_6).pTemp == (void *)0x0) &&
              (pvVar1 = pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar7]],
              *(long *)((long)pvVar1 + 0x40) != 0)) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7)
             ) {
            pAVar5 = Abc_NtkCreatePo(pNtk_00);
            Abc_ObjAddFanin(pAVar5,*(Abc_Obj_t **)((long)pvVar1 + 0x40));
            pcVar3 = Abc_ObjName(pAVar5);
            Abc_ObjAssignName(pAVar5,pcVar3,(char *)0x0);
          }
        }
      }
      iVar2 = pNtk->vObjs->nSize;
    }
    iVar6 = Abc_NtkCheck(pNtk_00);
    if (iVar6 == 0) {
      fwrite("Abc_NtkBottom(): Network check has failed.\n",0x2b,1,_stdout);
    }
    return pNtk_00;
  }
  __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                ,0x2f8,"Abc_Ntk_t *Abc_NtkBottom(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkBottom( Abc_Ntk_t * pNtk, int Level )
{
    char Buffer[500];
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) == 0 );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    sprintf( Buffer, "%s%s", pNtk->pName, "_bot" );
    pNtkNew->pName = Extra_UtilStrsav(Buffer);

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );

    // copy the internal nodes
    // duplicate the nets and nodes (CIs/COs/latches already dupped)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy == NULL && Abc_ObjIsNode(pObj) && Abc_ObjLevel(pObj) <= Level )
            Abc_NtkDupObj(pNtkNew, pObj, 0);
    // reconnect all objects (no need to transfer attributes on edges)
    Abc_NtkForEachObj( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( pObj->pCopy && pFanin->pCopy )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // create new primary outputs
    Abc_NtkForEachObj( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( !pObj->pCopy && pFanin->pCopy && Abc_ObjIsNode(pFanin) )
            {
                Abc_Obj_t * pNodeNew = Abc_NtkCreatePo(pNtkNew);
                Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
                Abc_ObjAssignName( pNodeNew, Abc_ObjName(pNodeNew), NULL );
            }

    // perform the final check
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkBottom(): Network check has failed.\n" );
    return pNtkNew;
}